

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.h
# Opt level: O0

int SetCommandRoboteq(ROBOTEQ *pRoboteq,int commandItem,int index,int value)

{
  int iVar1;
  char local_168 [8];
  char response [256];
  char args [50];
  char local_2e [8];
  char command [10];
  int value_local;
  int index_local;
  int commandItem_local;
  ROBOTEQ *pRoboteq_local;
  
  command._2_4_ = value;
  command._6_4_ = index;
  if ((commandItem < 0) || (0xff < commandItem)) {
    printf("Invalid parameter : commandItem %d.\n",(ulong)(uint)commandItem);
    pRoboteq_local._4_4_ = 1;
  }
  else {
    sprintf(local_2e,"$%02X",(ulong)(uint)commandItem);
    sprintf(response + 0xf8,"%i %i",(ulong)(uint)command._6_4_,(ulong)(uint)command._2_4_);
    if (command._6_4_ == -0x400) {
      if (command._2_4_ != -0x400) {
        sprintf(response + 0xf8,"%i",(ulong)(uint)command._2_4_);
      }
      command[6] = '\0';
      command[7] = '\0';
      command[8] = '\0';
      command[9] = '\0';
    }
    if ((int)command._6_4_ < 0) {
      printf("Invalid parameter : index %d.\n",(ulong)(uint)command._6_4_);
      pRoboteq_local._4_4_ = 1;
    }
    else {
      iVar1 = IssueCommandRoboteq(pRoboteq,"!",local_2e,response + 0xf8,10,local_168,1);
      if (iVar1 == 0) {
        if (local_168[0] == '+') {
          pRoboteq_local._4_4_ = 0;
        }
        else {
          printf("Error reading data from a Roboteq : Command not recognized or lost. \n");
          pRoboteq_local._4_4_ = 1;
        }
      }
      else {
        pRoboteq_local._4_4_ = 1;
      }
    }
  }
  return pRoboteq_local._4_4_;
}

Assistant:

inline int SetCommandRoboteq(ROBOTEQ* pRoboteq, int commandItem, int index, int value)
{
	char command[10];
	char args[50];
	char response[256];

	if ((commandItem < 0)||(commandItem > 255))
	{
		printf("Invalid parameter : commandItem %d.\n", commandItem);
		return EXIT_FAILURE;
	}

	sprintf(command, "$%02X", commandItem);
	sprintf(args, "%i %i", index, value);
	if (index == MISSING_VALUE_ROBOTEQ)
	{
		if(value != MISSING_VALUE_ROBOTEQ)
			sprintf(args, "%i", value);
		index = 0;
	}

	if (index < 0)
	{
		printf("Invalid parameter : index %d.\n", index);
		return EXIT_FAILURE;
	}

	if (IssueCommandRoboteq(pRoboteq, "!", command, args, 10, response, TRUE) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	if (response[0] != '+')
	{
		printf("Error reading data from a Roboteq : Command not recognized or lost. \n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}